

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O1

CURLcode cf_h2_proxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  tunnel_stream *ts;
  long *plVar1;
  undefined8 *puVar2;
  nghttp2_session **session_ptr;
  httpreq *req;
  nghttp2_data_source callbacks;
  CURLcode CVar3;
  int iVar4;
  uint uVar5;
  timediff_t tVar6;
  dynhds_entry *pdVar7;
  nghttp2_nv *nva;
  char *pcVar8;
  h2_tunnel_state new_state;
  CURLcode CVar9;
  char *pcVar10;
  undefined8 uVar11;
  _Bool _Var12;
  nghttp2_session_callbacks *cbs;
  int port;
  char *hostname;
  httpreq *local_a8;
  nghttp2_data_source local_a0;
  code *local_98;
  uint local_8c;
  undefined8 local_88;
  undefined8 local_80;
  void *local_78;
  nghttp2_session *local_70;
  dynhds local_68;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  plVar1 = (long *)cf->ctx;
  if ((cf->next->field_0x24 & 1) == 0) {
    CVar3 = Curl_conn_cf_connect(cf->next,data,blocking,done);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    if (*done != true) {
      return CURLE_OK;
    }
  }
  *done = false;
  puVar2 = (undefined8 *)cf->ctx;
  local_80 = puVar2[1];
  puVar2[1] = data;
  if (*plVar1 == 0) {
    local_a0.ptr = (nghttp2_session_callbacks *)0x0;
    memset(puVar2 + 0x12,0,0xa8);
    Curl_bufq_init((bufq *)(puVar2 + 2),0x4000,0x280);
    Curl_bufq_init((bufq *)(puVar2 + 10),0x4000,1);
    *(undefined4 *)(puVar2 + 0x26) = 0;
    *(undefined4 *)(puVar2 + 0x24) = 0xffffffff;
    Curl_bufq_init2((bufq *)(puVar2 + 0x13),0x4000,0x280,1);
    Curl_bufq_init((bufq *)(puVar2 + 0x1b),0x4000,8);
    CVar3 = Curl_http_proxy_get_destination
                      (cf,(char **)&local_68,(int *)&local_88,(_Bool *)&local_a8);
    if (CVar3 == CURLE_OK) {
      pcVar10 = "[";
      if ((char)local_a8 == '\0') {
        pcVar10 = "";
      }
      pcVar8 = "]";
      if ((char)local_a8 == '\0') {
        pcVar8 = "";
      }
      pcVar10 = curl_maprintf("%s%s%s:%d",pcVar10,CONCAT44(local_68.hds._4_4_,local_68.hds._0_4_),
                              pcVar8,(ulong)(uint)local_88);
      puVar2[0x23] = pcVar10;
      uVar11 = 0x1b;
      if (pcVar10 != (char *)0x0) {
        iVar4 = nghttp2_session_callbacks_new((nghttp2_session_callbacks **)&local_a0.ptr);
        if (iVar4 == 0) {
          nghttp2_session_callbacks_set_send_callback
                    ((nghttp2_session_callbacks *)local_a0.ptr,on_session_send);
          nghttp2_session_callbacks_set_on_frame_recv_callback
                    ((nghttp2_session_callbacks *)local_a0.ptr,proxy_h2_on_frame_recv);
          nghttp2_session_callbacks_set_on_frame_send_callback
                    ((nghttp2_session_callbacks *)local_a0.ptr,proxy_h2_on_frame_send);
          nghttp2_session_callbacks_set_on_data_chunk_recv_callback
                    ((nghttp2_session_callbacks *)local_a0.ptr,tunnel_recv_callback);
          nghttp2_session_callbacks_set_on_stream_close_callback
                    ((nghttp2_session_callbacks *)local_a0.ptr,proxy_h2_on_stream_close);
          nghttp2_session_callbacks_set_on_header_callback
                    ((nghttp2_session_callbacks *)local_a0.ptr,proxy_h2_on_header);
          callbacks = local_a0;
          session_ptr = (nghttp2_session **)cf->ctx;
          iVar4 = nghttp2_option_new((nghttp2_option **)&local_68);
          if (iVar4 == 0) {
            nghttp2_option_set_no_auto_window_update
                      ((nghttp2_option *)CONCAT44(local_68.hds._4_4_,local_68.hds._0_4_),1);
            nghttp2_option_set_no_rfc9113_leading_and_trailing_ws_validation
                      ((nghttp2_option *)CONCAT44(local_68.hds._4_4_,local_68.hds._0_4_),1);
            iVar4 = nghttp2_session_client_new2
                              (session_ptr,callbacks,cf,
                               (nghttp2_option *)CONCAT44(local_68.hds._4_4_,local_68.hds._0_4_));
            nghttp2_option_del((nghttp2_option *)CONCAT44(local_68.hds._4_4_,local_68.hds._0_4_));
            if (iVar4 == 0) {
              local_68.hds._0_4_ = 3;
              local_68.hds._4_4_ = Curl_multi_max_concurrent_streams(data->multi);
              local_68.hds_len = 0xa0000000000004;
              local_68.hds_allc = 2;
              uVar5 = nghttp2_submit_settings
                                ((nghttp2_session *)*puVar2,'\0',(nghttp2_settings_entry *)&local_68
                                 ,3);
              if (uVar5 == 0) {
                uVar11 = 0;
                uVar5 = nghttp2_session_set_local_window_size
                                  ((nghttp2_session *)*puVar2,'\0',0,0x6400000);
                if (uVar5 != 0) {
                  pcVar10 = nghttp2_strerror(uVar5);
                  Curl_failf(data,"nghttp2_session_set_local_window_size() failed: %s(%d)",pcVar10,
                             (ulong)uVar5);
                  uVar11 = 0x10;
                }
              }
              else {
                pcVar10 = nghttp2_strerror(uVar5);
                Curl_failf(data,"nghttp2_submit_settings() failed: %s(%d)",pcVar10,(ulong)uVar5);
                uVar11 = 0x10;
              }
              goto LAB_001520ea;
            }
          }
          pcVar10 = "Couldn\'t initialize nghttp2";
        }
        else {
          pcVar10 = "Couldn\'t initialize nghttp2 callbacks";
        }
        Curl_failf(data,pcVar10);
      }
    }
    else {
      uVar11 = 0x1b;
    }
LAB_001520ea:
    CVar3 = (CURLcode)uVar11;
    if ((nghttp2_session_callbacks *)local_a0.ptr != (nghttp2_session_callbacks *)0x0) {
      nghttp2_session_callbacks_del((nghttp2_session_callbacks *)local_a0.ptr);
    }
    if ((((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
      Curl_trc_cf_infof(data,cf,"[0] init proxy ctx -> %d",uVar11);
    }
    if (CVar3 != CURLE_OK) goto LAB_0015213a;
  }
  tVar6 = Curl_timeleft(data,(curltime *)0x0,true);
  if (0 < tVar6) {
    ts = (tunnel_stream *)(plVar1 + 0x12);
    local_78 = cf->ctx;
    CVar9 = CURLE_OK;
LAB_00151a9d:
    switch((int)plVar1[0x26]) {
    case 0:
      goto switchD_00151abc_caseD_0;
    case 1:
      goto switchD_00151abc_caseD_1;
    case 2:
      goto switchD_00151abc_caseD_2;
    case 3:
      CVar3 = CURLE_OK;
      goto LAB_0015213a;
    case 4:
      CVar3 = CURLE_RECV_ERROR;
      goto LAB_0015213a;
    default:
      goto switchD_00151abc_default;
    }
  }
  Curl_failf(data,"Proxy CONNECT aborted due to timeout");
  CVar3 = CURLE_OPERATION_TIMEDOUT;
LAB_0015213a:
  if (CVar3 == CURLE_OK) {
    _Var12 = (int)plVar1[0x26] == 3;
  }
  else {
    _Var12 = false;
  }
  *done = _Var12;
  cf->field_0x24 = cf->field_0x24 & 0xfe | _Var12;
  *(undefined8 *)((long)cf->ctx + 8) = local_80;
  return CVar3;
switchD_00151abc_caseD_0:
  if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
     (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
    Curl_trc_cf_infof(data,cf,"[0] CONNECT start for %s",plVar1[0x23]);
  }
  puVar2 = (undefined8 *)cf->ctx;
  local_a8 = (httpreq *)0x0;
  CVar3 = Curl_http_proxy_create_CONNECT(&local_a8,cf,data,2);
  if (CVar3 == CURLE_OK) {
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"Establish HTTP/2 proxy tunnel to %s",local_a8->authority);
    }
    req = local_a8;
    local_70 = (nghttp2_session *)*puVar2;
    Curl_dynhds_init(&local_68,0,0x100000);
    CVar3 = Curl_http_req_to_h2(&local_68,req,data);
    local_8c = 0xffffffff;
    if (CVar3 == CURLE_OK) {
      nva = Curl_dynhds_to_nva(&local_68,&local_88);
      if (nva == (nghttp2_nv *)0x0) {
        CVar3 = CURLE_OUT_OF_MEMORY;
        goto LAB_00151b92;
      }
      local_98 = tunnel_send_callback;
      CVar3 = CURLE_OK;
      local_a0 = (nghttp2_data_source)cf;
      uVar5 = nghttp2_submit_request
                        (local_70,(nghttp2_priority_spec *)0x0,nva,
                         CONCAT44(local_88._4_4_,(uint)local_88),(nghttp2_data_provider *)&local_a0,
                         ts);
      local_8c = uVar5;
      if ((int)uVar5 < 0) {
        pcVar10 = nghttp2_strerror(uVar5);
        Curl_failf(data,"nghttp2_session_upgrade2() failed: %s(%d)",pcVar10,(ulong)uVar5);
        CVar3 = CURLE_SEND_ERROR;
      }
    }
    else {
LAB_00151b92:
      nva = (nghttp2_nv *)0x0;
    }
    (*Curl_cfree)(nva);
    Curl_dynhds_free(&local_68);
    uVar5 = local_8c;
    *(uint *)(plVar1 + 0x24) = local_8c;
    if ((((CVar3 != CURLE_OK && data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
        ((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0)) && (0 < cf->cft->log_level)) {
      pcVar10 = nghttp2_strerror(local_8c);
      Curl_trc_cf_infof(data,cf,"[%d] send, nghttp2_submit_request error: %s",(ulong)uVar5,pcVar10);
    }
  }
  if (local_a8 != (httpreq *)0x0) {
    Curl_http_req_free(local_a8);
  }
  if (CVar3 != CURLE_OK) {
    Curl_failf(data,"Failed sending CONNECT to proxy");
    goto LAB_00151fce;
  }
  h2_tunnel_go_state(cf,ts,H2_TUNNEL_CONNECT,data);
switchD_00151abc_caseD_1:
  CVar9 = proxy_h2_progress_ingress(cf,data);
  if (CVar9 == CURLE_OK) {
    CVar9 = proxy_h2_progress_egress(cf,data);
  }
  if ((CVar9 == CURLE_OK) || (CVar9 == CURLE_AGAIN)) {
    if ((*(byte *)((long)plVar1 + 0x134) & 1) == 0) {
      CVar3 = CURLE_OK;
      goto LAB_00151fce;
    }
    h2_tunnel_go_state(cf,ts,H2_TUNNEL_RESPONSE,data);
switchD_00151abc_caseD_2:
    iVar4 = ts->resp->status;
    if (iVar4 - 200U < 100) {
      new_state = H2_TUNNEL_ESTABLISHED;
      if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
        Curl_infof(data,"CONNECT tunnel established, response %d");
      }
LAB_00151daa:
      h2_tunnel_go_state(cf,ts,new_state,data);
      CVar3 = CURLE_OK;
    }
    else {
      pcVar10 = "WWW-Authenticate";
      if (iVar4 == 0x191) {
LAB_00151ce9:
        pdVar7 = Curl_dynhds_cget(&ts->resp->headers,pcVar10);
      }
      else {
        if (iVar4 == 0x197) {
          pcVar10 = "Proxy-Authenticate";
          goto LAB_00151ce9;
        }
        pdVar7 = (dynhds_entry *)0x0;
      }
      CVar3 = CURLE_RECV_ERROR;
      if (pdVar7 != (dynhds_entry *)0x0) {
        if (((data != (Curl_easy *)0x0) && (cf != (Curl_cfilter *)0x0)) &&
           (((*(ulong *)&(data->set).field_0x8ba & 0x10000000) != 0 && (0 < cf->cft->log_level)))) {
          Curl_trc_cf_infof(data,cf,"[0] CONNECT: fwd auth header \'%s\'",pdVar7->value);
        }
        CVar3 = Curl_http_input_auth(data,ts->resp->status == 0x197,pdVar7->value);
        if (CVar3 == CURLE_OK) {
          pcVar10 = (data->req).newurl;
          CVar3 = CURLE_RECV_ERROR;
          if (pcVar10 != (char *)0x0) {
            (*Curl_cfree)(pcVar10);
            (data->req).newurl = (char *)0x0;
            new_state = H2_TUNNEL_INIT;
            goto LAB_00151daa;
          }
        }
      }
    }
    CVar9 = CURLE_OK;
    if (CVar3 != CURLE_OK) goto LAB_00151fce;
  }
  else {
    h2_tunnel_go_state(cf,ts,H2_TUNNEL_FAILED,data);
  }
switchD_00151abc_default:
  CVar3 = CVar9;
  if ((int)plVar1[0x26] != 0) goto LAB_00151fce;
  goto LAB_00151a9d;
LAB_00151fce:
  if ((CVar3 != CURLE_OK) || ((*(byte *)((long)local_78 + 0x134) & 2) != 0)) {
    h2_tunnel_go_state(cf,ts,H2_TUNNEL_FAILED,data);
  }
  goto LAB_0015213a;
}

Assistant:

static CURLcode cf_h2_proxy_connect(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool blocking, bool *done)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;
  struct cf_call_data save;
  timediff_t check;
  struct tunnel_stream *ts = &ctx->tunnel;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* Connect the lower filters first */
  if(!cf->next->connected) {
    result = Curl_conn_cf_connect(cf->next, data, blocking, done);
    if(result || !*done)
      return result;
  }

  *done = FALSE;

  CF_DATA_SAVE(save, cf, data);
  if(!ctx->h2) {
    result = cf_h2_proxy_ctx_init(cf, data);
    if(result)
      goto out;
  }
  DEBUGASSERT(ts->authority);

  check = Curl_timeleft(data, NULL, TRUE);
  if(check <= 0) {
    failf(data, "Proxy CONNECT aborted due to timeout");
    result = CURLE_OPERATION_TIMEDOUT;
    goto out;
  }

  /* for the secondary socket (FTP), use the "connect to host"
   * but ignore the "connect to port" (use the secondary port)
   */
  result = H2_CONNECT(cf, data, ts);

out:
  *done = (result == CURLE_OK) && (ts->state == H2_TUNNEL_ESTABLISHED);
  cf->connected = *done;
  CF_DATA_RESTORE(cf, save);
  return result;
}